

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O2

bool __thiscall llvm::yaml::Scanner::scanKey(Scanner *this)

{
  uint Level;
  Token local_48;
  
  Level = this->FlowLevel;
  if (Level == 0) {
    rollIndent(this,this->Column,TK_BlockMappingStart,(iterator)&(this->TokenQueue).List);
    Level = this->FlowLevel;
  }
  removeSimpleKeyCandidatesOnFlowLevel(this,Level);
  this->IsSimpleKeyAllowed = this->FlowLevel == 0;
  local_48.Value._M_dataplus._M_p = (pointer)&local_48.Value.field_2;
  local_48.Value._M_string_length = 0;
  local_48.Value.field_2._M_local_buf[0] = '\0';
  local_48.Kind = TK_Key;
  local_48.Range.Data = this->Current;
  local_48.Range.Length = 1;
  skip(this,1);
  AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
  ::push_back(&this->TokenQueue,&local_48);
  std::__cxx11::string::_M_dispose();
  return true;
}

Assistant:

bool Scanner::scanKey() {
  if (!FlowLevel)
    rollIndent(Column, Token::TK_BlockMappingStart, TokenQueue.end());

  removeSimpleKeyCandidatesOnFlowLevel(FlowLevel);
  IsSimpleKeyAllowed = !FlowLevel;

  Token T;
  T.Kind = Token::TK_Key;
  T.Range = StringRef(Current, 1);
  skip(1);
  TokenQueue.push_back(T);
  return true;
}